

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

QApplication * __thiscall QApplication::font(QApplication *this,QWidget *widget)

{
  Span *pSVar1;
  Type *this_00;
  QMetaObject *pQVar2;
  char *pcVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter pVar5;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                        *)this);
  if (((this_00 != (Type *)0x0 && widget != (QWidget *)0x0) && (this_00->d != (Data *)0x0)) &&
     (this_00->d->size != 0)) {
    pQVar2 = (QMetaObject *)(*(code *)**(undefined8 **)widget)(widget);
    pcVar3 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_50,pcVar3,-1);
    pVar5 = (piter)QHash<QByteArray,_QFont>::constFindImpl<QByteArray>(this_00,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (((pQVar2 != &QWidget::staticMetaObject) &&
        (pVar5.d == (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0)) && (pVar5.bucket == 0)) {
      do {
        pQVar2 = (pQVar2->d).superdata.direct;
        pcVar3 = (char *)QMetaObject::className();
        QByteArray::QByteArray(&local_50,pcVar3,-1);
        pVar5 = (piter)QHash<QByteArray,_QFont>::constFindImpl<QByteArray>(this_00,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
          }
        }
      } while (((pQVar2 != &QWidget::staticMetaObject) &&
               (pVar5.d == (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0)) &&
              (pVar5.bucket == 0));
    }
    if (pVar5.d != (Data<QHashPrivate::Node<QByteArray,_QFont>_> *)0x0 || pVar5.bucket != 0) {
      pSVar1 = (pVar5.d)->spans;
      uVar4 = pVar5.bucket >> 7;
      QFont::QFont((QFont *)this,
                   (QFont *)(pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)pVar5.bucket & 0x7f]]
                             .storage.data + 0x18));
      goto LAB_002bad77;
    }
  }
  QGuiApplication::font();
LAB_002bad77:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFont QApplication::font(const QWidget *widget)
{
    typedef FontHash::const_iterator FontHashConstIt;

    FontHash *hash = app_fonts();

    if (widget && hash  && hash->size()) {
#ifdef Q_OS_MAC
        // short circuit for small and mini controls
        if (widget->testAttribute(Qt::WA_MacSmallSize)) {
            return hash->value(QByteArrayLiteral("QSmallFont"));
        } else if (widget->testAttribute(Qt::WA_MacMiniSize)) {
            return hash->value(QByteArrayLiteral("QMiniFont"));
        }
#endif
        // Return the font for the nearest registered superclass
        const QMetaObject *metaObj = widget->metaObject();
        FontHashConstIt it = hash->constFind(metaObj->className());
        const FontHashConstIt cend = hash->constEnd();
        while (it == cend && metaObj != &QWidget::staticMetaObject) {
            metaObj = metaObj->superClass();
            it = hash->constFind(metaObj->className());
        }
        if (it != cend)
            return it.value();
    }
    return font();
}